

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void __thiscall SVGChart::PPlot::PPlot(PPlot *this)

{
  (this->super_PDrawer)._vptr_PDrawer = (_func_int **)&PTR__PPlot_00111770;
  (this->mPlotDataContainer).mXDataList.
  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPlotDataContainer).mXDataList.
  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPlotDataContainer).mXDataList.
  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPlotDataContainer).mYDataList.
  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPlotDataContainer).mYDataList.
  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPlotDataContainer).mYDataList.
  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPlotDataContainer).mLegendDataList.
  super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPlotDataContainer).mLegendDataList.
  super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPlotDataContainer).mLegendDataList.
  super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPlotDataContainer).mDataDrawerList.
  super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPlotDataContainer).mDataDrawerList.
  super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPlotDataContainer).mDataDrawerList.
  super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPlotDataContainer).mPlotDataSelectionList.
  super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPlotDataContainer).mPlotDataSelectionList.
  super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPlotDataContainer).mPlotDataSelectionList.
  super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AxisSetup::AxisSetup(&this->mXAxisSetup);
  AxisSetup::AxisSetup(&this->mYAxisSetup);
  (this->mGridInfo).mXGridOn = false;
  (this->mGridInfo).mYGridOn = false;
  (this->mMargins).mLeft = 0;
  (this->mMargins).mRight = 0;
  (this->mMargins).mTop = 0;
  (this->mMargins).mBottom = 0;
  PlotBackground::PlotBackground(&this->mPlotBackground);
  this->mHasAnyModifyingCalculatorBeenActive = false;
  (this->mModifyingCalculatorList).
  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mModifyingCalculatorList).
  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mModifyingCalculatorList).
  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPostCalculatorList).
  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostCalculatorList).
  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostCalculatorList).
  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPreDrawerList).
  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPreDrawerList).
  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPreDrawerList).
  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPostDrawerList).
  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostDrawerList).
  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostDrawerList).
  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mXTickIterator = &(this->mXLinTickIterator).super_TickIterator;
  this->mYTickIterator = &(this->mYLinTickIterator).super_TickIterator;
  this->mXTrafo = &(this->mXLinTrafo).super_Trafo;
  this->mYTrafo = &(this->mYLinTrafo).super_Trafo;
  (this->mXLinTrafo).super_Trafo._vptr_Trafo = (_func_int **)&PTR__Trafo_00111968;
  (this->mXLinTrafo).mOffset = 0.0;
  (this->mXLinTrafo).mSlope = 0.0;
  (this->mYLinTrafo).super_Trafo._vptr_Trafo = (_func_int **)&PTR__Trafo_00111968;
  (this->mYLinTrafo).mOffset = 0.0;
  (this->mYLinTrafo).mSlope = 0.0;
  (this->mXLogTrafo).super_Trafo._vptr_Trafo = (_func_int **)&PTR__Trafo_001119b0;
  (this->mXLogTrafo).mOffset = 0.0;
  (this->mXLogTrafo).mSlope = 0.0;
  (this->mXLogTrafo).mBase = 10.0;
  (this->mXLogTrafo).mFactor = 1.0;
  (this->mYLogTrafo).super_Trafo._vptr_Trafo = (_func_int **)&PTR__Trafo_001119b0;
  (this->mYLogTrafo).mOffset = 0.0;
  (this->mYLogTrafo).mSlope = 0.0;
  (this->mYLogTrafo).mBase = 10.0;
  (this->mYLogTrafo).mFactor = 1.0;
  (this->mXLinTickIterator).super_TickIterator.mAxisSetup = (AxisSetup *)0x0;
  (this->mXLinTickIterator).super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__LinTickIterator_001119f8;
  (this->mXLinTickIterator).mCurrentTick = 0.0;
  (this->mXLinTickIterator).mDelta = 0.0;
  (this->mXLinTickIterator).mFormatString._M_dataplus._M_p =
       (pointer)&(this->mXLinTickIterator).mFormatString.field_2;
  (this->mXLinTickIterator).mFormatString._M_string_length = 0;
  (this->mXLinTickIterator).mFormatString.field_2._M_local_buf[0] = '\0';
  (this->mYLinTickIterator).super_TickIterator.mAxisSetup = (AxisSetup *)0x0;
  (this->mYLinTickIterator).super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__LinTickIterator_001119f8;
  (this->mYLinTickIterator).mCurrentTick = 0.0;
  (this->mYLinTickIterator).mDelta = 0.0;
  (this->mYLinTickIterator).mFormatString._M_dataplus._M_p =
       (pointer)&(this->mYLinTickIterator).mFormatString.field_2;
  (this->mYLinTickIterator).mFormatString._M_string_length = 0;
  (this->mYLinTickIterator).mFormatString.field_2._M_local_buf[0] = '\0';
  (this->mXLogTickIterator).super_TickIterator.mAxisSetup = (AxisSetup *)0x0;
  (this->mXLogTickIterator).super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__TickIterator_00111a50;
  (this->mXLogTickIterator).mCurrentTick = 0.0;
  (this->mXLogTickIterator).mDelta = 0.0;
  (this->mYLogTickIterator).super_TickIterator.mAxisSetup = (AxisSetup *)0x0;
  (this->mYLogTickIterator).super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__TickIterator_00111a50;
  (this->mYLogTickIterator).mCurrentTick = 0.0;
  (this->mYLogTickIterator).mDelta = 0.0;
  NamedTickIterator::NamedTickIterator(&this->mXNamedTickIterator);
  this->mPPlotDrawer = (PDrawer *)0x0;
  this->mOwnsPPlotDrawer = true;
  (this->mMargins).mTop = 5;
  (this->mMargins).mBottom = 0x2a;
  (this->mMargins).mLeft = 0x28;
  (this->mMargins).mRight = 0x14;
  (this->mYAxisSetup).mAscending = false;
  return;
}

Assistant:

PPlot::PPlot ():
      mHasAnyModifyingCalculatorBeenActive (false),
      mXTickIterator (&mXLinTickIterator),
      mYTickIterator (&mYLinTickIterator),
      mXTrafo (&mXLinTrafo),
      mYTrafo (&mYLinTrafo),
      mOwnsPPlotDrawer (true)
    
    {
       mMargins = kDefaultMargins;
       mYAxisSetup.mAscending = false;
    }